

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[24],char_const*,char[15],char[21],unsigned_long,char[42],unsigned_long,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [24],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [21],unsigned_long *Args_4,char (*Args_5) [42],
          unsigned_long *Args_6,char (*Args_7) [2])

{
  stringstream local_1c8 [8];
  stringstream ss;
  unsigned_long *Args_local_4;
  char (*Args_local_3) [21];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [24];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[24],char_const*,char[15],char[21],unsigned_long,char[42],unsigned_long,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [24])this,(char **)Args,(char (*) [15])Args_1,(char (*) [21])Args_2,
             (unsigned_long *)Args_3,(char (*) [42])Args_4,(unsigned_long *)Args_5,
             (char (*) [2])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}